

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O3

int __thiscall iDynTree::Visualizer::height(Visualizer *this)

{
  return 0;
}

Assistant:

int Visualizer::height() const
{
#ifdef IDYNTREE_USES_IRRLICHT
    if( !pimpl->m_isInitialized )
    {
        reportError("Visualizer","height","Visualizer not initialized.");
        return 0;
    }

#ifdef IDYNTREE_USE_GLFW_WINDOW
    GLint ww, wh;
    glfwGetWindowSize(pimpl->m_window, &ww, &wh);

    return wh;
#else
    auto winDimensions = pimpl->m_irrDriver->getScreenSize();
    return winDimensions.Height;
#endif
#else
    return 0;
#endif
}